

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_Vk.cpp
# Opt level: O2

void __thiscall
Diligent::SerializedPipelineStateImpl::PatchShadersVk<Diligent::TilePipelineStateCreateInfo>
          (SerializedPipelineStateImpl *this,TilePipelineStateCreateInfo *CreateInfo)

{
  pointer pvVar1;
  SHADER_TYPE *pSVar2;
  Uint32 SignatureCount;
  SerializedPipelineStateImpl *pSVar3;
  pointer pSVar4;
  pointer pSVar5;
  int iVar6;
  undefined4 extraout_var;
  pointer pcVar7;
  size_t sVar8;
  char (*in_RCX) [57];
  char *Args_1;
  TBindIndexToDescSetIndex *BindIndexToDescSetIndex;
  long lVar9;
  IShader *pIVar10;
  IPipelineResourceSignature **ppSrcSignatures;
  ulong uVar11;
  uint uVar12;
  size_t i;
  ulong uVar13;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar14;
  char *pcVar15;
  char *pcVar16;
  ShaderStageInfo *this_00;
  Uint32 SignaturesCount;
  SerializedPipelineStateImpl *local_168;
  TShaderStages ShaderStagesVk;
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ShaderStages;
  string msg_5;
  RefCntAutoPtr<Diligent::SerializedShaderImpl> pShaderImpl;
  string msg;
  IPipelineResourceSignature *DefaultSignatures [1];
  
  ShaderStages.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ShaderStages.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ShaderStages.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_LAST) {
    FormatString<char[26],char[36]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.IsTilePipeline()",(char (*) [36])in_RCX);
    in_RCX = (char (*) [57])0x15a;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x15a);
    std::__cxx11::string::~string((string *)&msg);
  }
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ::clear(&ShaderStages);
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_LAST) {
    FormatString<char[26],char[54]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.PipelineType == PIPELINE_TYPE_TILE",
               (char (*) [54])in_RCX);
    in_RCX = (char (*) [57])0x15e;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x15e);
    std::__cxx11::string::~string((string *)&msg);
  }
  pIVar10 = CreateInfo->pTS;
  if (pIVar10 == (IShader *)0x0) {
    FormatString<char[26],char[26]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.pTS != nullptr",(char (*) [26])in_RCX);
    in_RCX = (char (*) [57])0x15f;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x15f);
    std::__cxx11::string::~string((string *)&msg);
    pIVar10 = CreateInfo->pTS;
  }
  iVar6 = (*(pIVar10->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  if (*(int *)(CONCAT44(extraout_var,iVar6) + 8) != 0x4000) {
    FormatString<char[26],char[57]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.pTS->GetDesc().ShaderType == SHADER_TYPE_TILE",in_RCX);
    in_RCX = (char (*) [57])0x160;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x160);
    std::__cxx11::string::~string((string *)&msg);
  }
  local_168 = this;
  RefCntAutoPtr<Diligent::SerializedShaderImpl>::RefCntAutoPtr
            (&pShaderImpl,(IObject *)CreateInfo->pTS,
             (INTERFACE_ID *)SerializedShaderImpl::IID_InternalImpl);
  if (pShaderImpl.m_pObject == (SerializedShaderImpl *)0x0) {
    FormatString<char[40]>(&msg,(char (*) [40])"Unexpected shader object implementation");
    in_RCX = (char (*) [57])0x163;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x163);
    std::__cxx11::string::~string((string *)&msg);
  }
  PipelineStateUtils::WaitUntilShaderReadyIfRequested<Diligent::SerializedShaderImpl>
            (&pShaderImpl,true);
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>>
  ::emplace_back<Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>&>
            ((vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>>
              *)&ShaderStages,&pShaderImpl);
  pSVar5 = ShaderStages.
           super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar4 = ShaderStages.
           super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ShaderStages.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      ShaderStages.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[22]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"!ShaderStages.empty()",
               (char (*) [22])in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x168);
    std::__cxx11::string::~string((string *)&msg);
  }
  RefCntAutoPtr<Diligent::SerializedShaderImpl>::Release(&pShaderImpl);
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::vector(&ShaderStagesVk,((long)pSVar5 - (long)pSVar4) / 0x50,(allocator_type *)&msg);
  pvVar14 = &(pSVar4->super_ShaderStageInfo).SPIRVs;
  lVar9 = 0x20;
  uVar11 = 0;
  while( true ) {
    pSVar3 = local_168;
    if ((ulong)(((long)ShaderStagesVk.
                       super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)ShaderStagesVk.
                      super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x38) <= uVar11) break;
    pSVar2 = &(ShaderStagesVk.
               super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
               ._M_impl.super__Vector_impl_data._M_start)->Type;
    *(undefined4 *)
     ((long)ShaderStagesVk.
            super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
            ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x20) =
         *(undefined4 *)((long)(pvVar14 + -2) + 0x10);
    std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>::
    _M_move_assign((vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                    *)((long)ShaderStagesVk.
                             super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x18),
                   (vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                    *)(pvVar14 + -1),
                   ((long)ShaderStagesVk.
                          super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)ShaderStagesVk.
                         super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start) % 0x38);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::_M_move_assign((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)((long)pSVar2 + lVar9),pvVar14);
    uVar11 = uVar11 + 1;
    lVar9 = lVar9 + 0x38;
    pvVar14 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)((long)(pvVar14 + 3) + 8);
  }
  ppSrcSignatures = (CreateInfo->super_PipelineStateCreateInfo).ppResourceSignatures;
  SignaturesCount = (CreateInfo->super_PipelineStateCreateInfo).ResourceSignaturesCount;
  DefaultSignatures[0] = (IPipelineResourceSignature *)0x0;
  if (SignaturesCount == 0) {
    CreateDefaultResourceSignature<Diligent::PipelineStateVkImpl,Diligent::PipelineResourceSignatureVkImpl,std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>>
              (local_168,Vulkan,(PipelineStateDesc *)CreateInfo,SHADER_TYPE_LAST,&ShaderStagesVk);
    DefaultSignatures[0] = (IPipelineResourceSignature *)(pSVar3->m_pDefaultSignature).m_pObject;
    ppSrcSignatures = DefaultSignatures;
    SignaturesCount = 1;
  }
  msg.field_2._M_allocated_capacity = 0;
  msg.field_2._8_8_ = 0;
  msg._M_dataplus._M_p = (pointer)0x0;
  msg._M_string_length = 0;
  Args_1 = (char *)&SignaturesCount;
  anon_unknown_60::SortResourceSignatures<Diligent::PipelineResourceSignatureVkImpl>
            (ppSrcSignatures,SignaturesCount,
             (SignatureArray<Diligent::PipelineResourceSignatureVkImpl> *)&msg,(Uint32 *)Args_1);
  SignatureCount = SignaturesCount;
  pShaderImpl.m_pObject = (SerializedShaderImpl *)0x0;
  pcVar16 = (char *)(ulong)SignaturesCount;
  uVar12 = 0;
  for (pcVar15 = (char *)0x0; pSVar3 = local_168, pcVar15 != pcVar16; pcVar15 = pcVar15 + 1) {
    pcVar7 = (&msg._M_dataplus)[(long)pcVar15]._M_p;
    if (pcVar7 != (pointer)0x0) {
      if (pcVar15 != (char *)(ulong)(byte)pcVar7[0x3c]) {
        FormatString<char[26],char[40]>
                  (&msg_5,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"pSignature->GetDesc().BindingIndex == i",
                   (char (*) [40])(ulong)(byte)pcVar7[0x3c]);
        DebugAssertionFailed
                  (msg_5._M_dataplus._M_p,"PatchShadersVk",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Vk.cpp"
                   ,0xa4);
        std::__cxx11::string::~string((string *)&msg_5);
        pcVar7 = (&msg._M_dataplus)[(long)pcVar15]._M_p;
      }
      msg_5._M_dataplus._M_p = (pointer)0x0;
      *(uint *)((long)&pShaderImpl.m_pObject + (long)pcVar15 * 4) = uVar12;
      msg_5._M_string_length = 1;
      for (Args_1 = (char *)0x0; Args_1 != (char *)0x10; Args_1 = Args_1 + 8) {
        uVar12 = uVar12 + (*(int *)(pcVar7 + *(long *)((long)&msg_5._M_dataplus._M_p + (long)Args_1)
                                             * 4 + 0x108) != -1);
      }
    }
  }
  if (0x10 < uVar12) {
    FormatString<char[26],char[50]>
              (&msg_5,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2",
               (char (*) [50])Args_1);
    DebugAssertionFailed
              (msg_5._M_dataplus._M_p,"PatchShadersVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Vk.cpp"
               ,0xad);
    std::__cxx11::string::~string((string *)&msg_5);
  }
  BindIndexToDescSetIndex = (TBindIndexToDescSetIndex *)&pShaderImpl;
  PipelineStateVkImpl::RemapOrVerifyShaderResources
            (&ShaderStagesVk,(RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)&msg,
             SignatureCount,BindIndexToDescSetIndex,false,(pSVar3->m_Data).Aux.NoShaderReflection,
             (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name,
             (TShaderResources *)0x0,(TResourceAttibutions *)0x0);
  std::array<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>,_8UL>::~array
            ((array<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>,_8UL> *)&msg)
  ;
  if ((pSVar3->m_Data).Shaders._M_elems[3].
      super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pSVar3->m_Data).Shaders._M_elems[3].
      super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[64]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Data.Shaders[static_cast<size_t>(DeviceType::Vulkan)].empty()",
               (char (*) [64])BindIndexToDescSetIndex);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"PatchShadersVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Vk.cpp"
               ,0xb9);
    std::__cxx11::string::~string((string *)&msg);
  }
  uVar11 = 0;
  while( true ) {
    if ((ulong)(((long)ShaderStagesVk.
                       super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)ShaderStagesVk.
                      super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x38) <= uVar11) break;
    this_00 = ShaderStagesVk.
              super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar11;
    lVar9 = 1;
    uVar13 = 0;
    while( true ) {
      sVar8 = PipelineStateVkImpl::ShaderStageInfo::Count(this_00);
      if (sVar8 <= uVar13) break;
      pvVar1 = (this_00->SPIRVs).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      memcpy((ShaderCreateInfo *)&msg,
             &pSVar4[uVar11].Serialized.
              super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar13]->m_CreateInfo,0x98);
      msg.field_2._M_allocated_capacity = 0;
      msg._M_dataplus._M_p = (pointer)0x0;
      msg.field_2._8_8_ = *(undefined8 *)((long)pvVar1 + lVar9 * 8 + -8);
      SerializeShaderCreateInfo(local_168,Vulkan,(ShaderCreateInfo *)&msg);
      uVar13 = uVar13 + 1;
      lVar9 = lVar9 + 3;
    }
    uVar11 = uVar11 + 1;
  }
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::~vector(&ShaderStagesVk);
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ::~vector(&ShaderStages);
  return;
}

Assistant:

void SerializedPipelineStateImpl::PatchShadersVk(const CreateInfoType& CreateInfo) noexcept(false)
{
    std::vector<ShaderStageInfoVk> ShaderStages;
    SHADER_TYPE                    ActiveShaderStages    = SHADER_TYPE_UNKNOWN;
    constexpr bool                 WaitUntilShadersReady = true;
    PipelineStateUtils::ExtractShaders<SerializedShaderImpl>(CreateInfo, ShaderStages, WaitUntilShadersReady, ActiveShaderStages);

    PipelineStateVkImpl::TShaderStages ShaderStagesVk{ShaderStages.size()};
    for (size_t i = 0; i < ShaderStagesVk.size(); ++i)
    {
        auto& Src   = ShaderStages[i];
        auto& Dst   = ShaderStagesVk[i];
        Dst.Type    = Src.Type;
        Dst.Shaders = std::move(Src.Shaders);
        Dst.SPIRVs  = std::move(Src.SPIRVs);
    }

    auto** ppSignatures    = CreateInfo.ppResourceSignatures;
    auto   SignaturesCount = CreateInfo.ResourceSignaturesCount;

    IPipelineResourceSignature* DefaultSignatures[1] = {};
    if (CreateInfo.ResourceSignaturesCount == 0)
    {
        CreateDefaultResourceSignature<PipelineStateVkImpl, PipelineResourceSignatureVkImpl>(DeviceType::Vulkan, CreateInfo.PSODesc, ActiveShaderStages, ShaderStagesVk);

        DefaultSignatures[0] = m_pDefaultSignature;
        SignaturesCount      = 1;
        ppSignatures         = DefaultSignatures;
    }

    {
        // Sort signatures by binding index.
        // Note that SignaturesCount will be overwritten with the maximum binding index.
        SignatureArray<PipelineResourceSignatureVkImpl> Signatures = {};
        SortResourceSignatures(ppSignatures, SignaturesCount, Signatures, SignaturesCount);

        // Same as PipelineLayoutVk::Create()
        PipelineStateVkImpl::TBindIndexToDescSetIndex BindIndexToDescSetIndex = {};
        Uint32                                        DescSetLayoutCount      = 0;
        for (Uint32 i = 0; i < SignaturesCount; ++i)
        {
            const auto& pSignature = Signatures[i];
            if (pSignature == nullptr)
                continue;

            VERIFY_EXPR(pSignature->GetDesc().BindingIndex == i);
            BindIndexToDescSetIndex[i] = StaticCast<PipelineStateVkImpl::TBindIndexToDescSetIndex::value_type>(DescSetLayoutCount);

            for (auto SetId : {PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_STATIC_MUTABLE, PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC})
            {
                if (pSignature->GetDescriptorSetSize(SetId) != ~0u)
                    ++DescSetLayoutCount;
            }
        }
        VERIFY_EXPR(DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2);

        const auto bStripReflection = m_Data.Aux.NoShaderReflection;
        PipelineStateVkImpl::RemapOrVerifyShaderResources(ShaderStagesVk,
                                                          Signatures.data(),
                                                          SignaturesCount,
                                                          BindIndexToDescSetIndex,
                                                          false, // bVerifyOnly
                                                          bStripReflection,
                                                          CreateInfo.PSODesc.Name);
    }

    VERIFY_EXPR(m_Data.Shaders[static_cast<size_t>(DeviceType::Vulkan)].empty());
    for (size_t j = 0; j < ShaderStagesVk.size(); ++j)
    {
        const auto& Stage = ShaderStagesVk[j];
        for (size_t i = 0; i < Stage.Count(); ++i)
        {
            const auto& SPIRV     = Stage.SPIRVs[i];
            auto        ShaderCI  = ShaderStages[j].Serialized[i]->GetCreateInfo();
            ShaderCI.Source       = nullptr;
            ShaderCI.FilePath     = nullptr;
            ShaderCI.Macros       = {};
            ShaderCI.ByteCode     = SPIRV.data();
            ShaderCI.ByteCodeSize = SPIRV.size() * sizeof(SPIRV[0]);
            SerializeShaderCreateInfo(DeviceType::Vulkan, ShaderCI);
        }
    }
}